

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::SetInertiaXX(ChParticleCloud *this,ChVector<double> *iner)

{
  assign_op<double,_double> local_9;
  SrcXprType local_8;
  
  local_8.m_xpr = (XprTypeNested)&this->particle_mass;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       iner->m_data[0];
  *(double *)
   ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = iner->m_data[1];
  *(double *)
   ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = iner->m_data[2];
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&(this->particle_mass).inv_inertia.super_Matrix<double,_3,_3,_1,_3,_3>,&local_8,&local_9);
  return;
}

Assistant:

void ChParticleCloud::SetInertiaXX(const ChVector<>& iner) {
    particle_mass.GetBodyInertia()(0, 0) = iner.x();
    particle_mass.GetBodyInertia()(1, 1) = iner.y();
    particle_mass.GetBodyInertia()(2, 2) = iner.z();
    particle_mass.GetBodyInvInertia() = particle_mass.GetBodyInertia().inverse();
}